

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O0

void __thiscall
lf::fe::HierarchicScalarFESpace<double>::
HierarchicScalarFESpace<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&,void>
          (HierarchicScalarFESpace<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          AllCodimMeshDataSet<unsigned_int> *degree_functor)

{
  anon_class_8_1_37ba63de local_48;
  shared_ptr<const_lf::mesh::Mesh> local_40 [2];
  AllCodimMeshDataSet<unsigned_int> *local_20;
  AllCodimMeshDataSet<unsigned_int> *degree_functor_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  HierarchicScalarFESpace<double> *this_local;
  
  (this->super_ScalarFESpace<double>)._vptr_ScalarFESpace = (_func_int **)0x0;
  local_20 = degree_functor;
  degree_functor_local = (AllCodimMeshDataSet<unsigned_int> *)mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  ScalarFESpace<double>::ScalarFESpace(&this->super_ScalarFESpace<double>);
  (this->super_ScalarFESpace<double>)._vptr_ScalarFESpace = (_func_int **)&PTR_Mesh_00885d78;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            (&this->mesh_p_,(shared_ptr<const_lf::mesh::Mesh> *)degree_functor_local);
  quad::QuadRuleCache::QuadRuleCache(&this->qr_cache_);
  mesh::utils::
  AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  ::AllCodimMeshDataSet(&this->ref_el_,(shared_ptr<const_lf::mesh::Mesh> *)degree_functor_local);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            (local_40,(shared_ptr<const_lf::mesh::Mesh> *)degree_functor_local);
  local_48.degree_functor = local_20;
  assemble::DynamicFEDofHandler::
  DynamicFEDofHandler<lf::fe::HierarchicScalarFESpace<double>::HierarchicScalarFESpace<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&,void>(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&)::_lambda(lf::mesh::Entity_const&)_1_>
            (&this->dofh_,local_40,&local_48);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(local_40);
  Init<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&>(this,local_20);
  return;
}

Assistant:

explicit HierarchicScalarFESpace(
      const std::shared_ptr<const lf::mesh::Mesh> &mesh_p, F &&degree_functor)
      : ScalarFESpace<SCALAR>(),
        mesh_p_(mesh_p),
        ref_el_(mesh_p),
        dofh_(mesh_p,
              [&degree_functor](const mesh::Entity &e) -> base::size_type {
                if (e.RefEl() == base::RefEl::kPoint()) {
                  return 1;
                }
                auto degree = degree_functor(e);
                switch (e.RefEl()) {
                  case base::RefEl::kSegment():
                    return degree - 1;
                  case base::RefEl::kTria():
                    return degree <= 2 ? 0 : (degree - 2) * (degree - 1) / 2;
                  case base::RefEl::kQuad():
                    return (degree - 1) * (degree - 1);
                  default:
                    LF_VERIFY_MSG(false, "Something went wrong.");
                }
              }) {
    Init(std::forward<F>(degree_functor));
  }